

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void asl::os_error(char *msg)

{
  char *msg_local;
  
  fprintf(_stderr,"Error: %s\n",msg);
  exit(1);
}

Assistant:

void os_error(const char* msg)
{
	fprintf(stderr, "Error: %s\n", msg);
#if 0 // def _WIN32
	LPVOID message;
	FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM,
		NULL, GetLastError(), MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), (LPTSTR)&message, 0, NULL);
	MessageBoxA(NULL, (const char*)message, msg, MB_OK);
	LocalFree(message);
#endif
	exit(1);
}